

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

QRect __thiscall QToolBarAreaLayout::fitLayout(QToolBarAreaLayout *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QSize QVar5;
  QSize QVar6;
  QSize QVar7;
  QSize QVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  undefined8 uVar14;
  QRect QVar15;
  
  if (this->visible == false) {
    uVar9._0_4_ = (this->rect).x1;
    uVar9._4_4_ = (this->rect).y1;
    uVar14._0_4_ = (this->rect).x2;
    uVar14._4_4_ = (this->rect).y2;
    uVar13 = uVar9 >> 0x20;
  }
  else {
    QVar5 = QToolBarAreaLayoutInfo::sizeHint(this->docks);
    QVar6 = QToolBarAreaLayoutInfo::sizeHint(this->docks + 1);
    QVar7 = QToolBarAreaLayoutInfo::sizeHint(this->docks + 2);
    QVar8 = QToolBarAreaLayoutInfo::sizeHint(this->docks + 3);
    iVar1 = (this->rect).x1.m_i;
    iVar2 = (this->rect).y1.m_i;
    uVar9 = (ulong)(uint)(iVar1 + QVar5.wd.m_i.m_i);
    uVar12 = iVar2 + QVar7.ht.m_i.m_i;
    uVar13 = (ulong)uVar12;
    iVar3 = (this->rect).x2.m_i;
    iVar10 = iVar3 - QVar6.wd.m_i;
    iVar4 = (this->rect).y2.m_i;
    iVar11 = iVar4 - QVar8.ht.m_i;
    uVar14 = CONCAT44(iVar11,iVar10);
    this->docks[2].rect.x1.m_i = iVar1;
    this->docks[2].rect.y1.m_i = iVar2;
    this->docks[2].rect.x2.m_i = iVar3;
    this->docks[2].rect.y2.m_i = iVar2 + QVar7.ht.m_i.m_i + -1;
    this->docks[0].rect.x1.m_i = iVar1;
    this->docks[0].rect.y1.m_i = uVar12;
    this->docks[0].rect.x2.m_i = iVar1 + -1 + QVar5.wd.m_i.m_i;
    this->docks[0].rect.y2.m_i = iVar11;
    this->docks[1].rect.x1.m_i = iVar10 + 1;
    this->docks[1].rect.y1.m_i = uVar12;
    this->docks[1].rect.x2.m_i = iVar3;
    this->docks[1].rect.y2.m_i = iVar11;
    this->docks[3].rect.x1.m_i = iVar1;
    this->docks[3].rect.y1.m_i = iVar11 + 1;
    this->docks[3].rect.x2.m_i = iVar3;
    this->docks[3].rect.y2.m_i = iVar4;
    QToolBarAreaLayoutInfo::fitLayout(this->docks + 2);
    QToolBarAreaLayoutInfo::fitLayout(this->docks);
    QToolBarAreaLayoutInfo::fitLayout(this->docks + 1);
    QToolBarAreaLayoutInfo::fitLayout(this->docks + 3);
  }
  QVar15._0_8_ = uVar9 & 0xffffffff | uVar13 << 0x20;
  QVar15.x2.m_i = (int)uVar14;
  QVar15.y2.m_i = (int)((ulong)uVar14 >> 0x20);
  return QVar15;
}

Assistant:

QRect QToolBarAreaLayout::fitLayout()
{
    if (!visible)
        return rect;

    QSize left_hint = docks[QInternal::LeftDock].sizeHint();
    QSize right_hint = docks[QInternal::RightDock].sizeHint();
    QSize top_hint = docks[QInternal::TopDock].sizeHint();
    QSize bottom_hint = docks[QInternal::BottomDock].sizeHint();

    QRect center = rect.adjusted(left_hint.width(), top_hint.height(),
                                    -right_hint.width(), -bottom_hint.height());

    docks[QInternal::TopDock].rect = QRect(rect.left(), rect.top(),
                                rect.width(), top_hint.height());
    docks[QInternal::LeftDock].rect = QRect(rect.left(), center.top(),
                                left_hint.width(), center.height());
    docks[QInternal::RightDock].rect = QRect(center.right() + 1, center.top(),
                                    right_hint.width(), center.height());
    docks[QInternal::BottomDock].rect = QRect(rect.left(), center.bottom() + 1,
                                    rect.width(), bottom_hint.height());

    docks[QInternal::TopDock].fitLayout();
    docks[QInternal::LeftDock].fitLayout();
    docks[QInternal::RightDock].fitLayout();
    docks[QInternal::BottomDock].fitLayout();

    return center;
}